

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tests.cpp
# Opt level: O1

void __thiscall
MatrixTests_SubtractConstantFromMatrix_Test::TestBody
          (MatrixTests_SubtractConstantFromMatrix_Test *this)

{
  bool bVar1;
  long lVar2;
  char *message;
  AssertionResult gtest_ar;
  double sum;
  matrix res;
  matrix mat;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  AssertHelper local_e8;
  internal local_e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  double local_d0 [25];
  
  local_d0[0xd] = 4.44659081257122e-323;
  local_d0[0xe] = 1.48219693752374e-323;
  local_d0[0xf] = 1.48219693752374e-323;
  lVar2 = 0x18;
  do {
    *(undefined8 *)((long)local_d0 + lVar2 + 0x68) = 0x4014000000000000;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x60);
  local_d0[1] = 4.44659081257122e-323;
  lVar2 = 3;
  local_d0[2] = 1.48219693752374e-323;
  local_d0[3] = 1.48219693752374e-323;
  local_d0[4] = 0.0;
  local_d0[5] = 0.0;
  local_d0[6] = 0.0;
  local_d0[7] = 0.0;
  local_d0[8] = 0.0;
  local_d0[9] = 0.0;
  local_d0[10] = 0.0;
  local_d0[0xb] = 0.0;
  local_d0[0xc] = 0.0;
  do {
    local_d0[lVar2 + 1] = local_d0[lVar2 + 0xd] + -5.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xc);
  lVar2 = 0x18;
  local_d0[0] = 0.0;
  do {
    local_d0[0] = local_d0[0] + *(double *)((long)local_d0 + lVar2 + 8);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x60);
  local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<double,double>(local_e0,"sum","0.0",local_d0,(double *)&local_f0);
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/matrix_tests.cpp"
               ,0x4f,message);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f0.ptr_ + 8))();
      }
      local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(MatrixTests, ChainedOperations)
{
	using matrix = mcc::matrix<double, 3, 3>;
	matrix first(1.0);
	matrix second(2.0);
	matrix third(3.0);

	matrix res1 = first + second + third;
	const auto sum = std::accumulate(res1.begin(), res1.end(), 0.0);
	ASSERT_EQ(sum, (1.0 + 2.0 + 3.0) * res1.size());

	matrix res2 = first + second + third + 6.0;
	const auto sum2 = std::accumulate(res2.begin(), res2.end(), 0.0);
	ASSERT_EQ(sum2, (1.0 + 2.0 + 3.0 + 6.0) * res2.size());

	matrix res3 = first + 10.0 + second + third;
	const auto sum3 = std::accumulate(res3.begin(), res3.end(), 0.0);
	ASSERT_EQ(sum3, (1.0 + 10.0 + 2.0 + 3.0) * res3.size());

	matrix res4 = (first + second) - third;
	const auto sum4 = std::accumulate(res4.begin(), res4.end(), 0.0);
	ASSERT_EQ(sum4, 0.0);
}